

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

size_t __thiscall Reducer::reduceDestructively(Reducer *this,int factor_)

{
  size_t sVar1;
  bool bVar2;
  ostream *o;
  undefined1 local_50 [8];
  ProgramResult result;
  
  this->factor = factor_;
  loadWorking(this);
  this->reduced = 0;
  this->funcsSeen = 0;
  result._0_8_ = &result.output._M_string_length;
  result.output._M_dataplus._M_p = (pointer)0x0;
  result.output._M_string_length._0_1_ = 0;
  bVar2 = writeAndTestReduction(this,(ProgramResult *)local_50);
  if (!bVar2) {
    o = std::operator<<((ostream *)&std::cerr,
                        "\n|! WARNING: writing before destructive reduction fails, very unlikely reduction can work\n"
                       );
    ProgramResult::dump((ProgramResult *)local_50,o);
    std::operator<<(o,'\n');
  }
  wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::walkModule
            (&(this->
              super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
              ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
              super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
             (this->
             super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
             ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
             super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.currModule);
  sVar1 = this->reduced;
  std::__cxx11::string::~string((string *)&result);
  return sVar1;
}

Assistant:

size_t reduceDestructively(int factor_) {
    factor = factor_;
    // prepare
    loadWorking();
    reduced = 0;
    funcsSeen = 0;
    // Before we do any changes, it should be valid to write out the module:
    // size should be as expected, and output should be as expected.
    ProgramResult result;
    if (!writeAndTestReduction(result)) {
      std::cerr << "\n|! WARNING: writing before destructive reduction fails, "
                   "very unlikely reduction can work\n"
                << result << '\n';
    }
    // destroy!
    walkModule(getModule());
    return reduced;
  }